

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_empty.c
# Opt level: O0

void test_read_format_empty(void)

{
  archive *a_00;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  archive *a;
  archive_entry *ae;
  void *in_stack_00000020;
  archive *in_stack_ffffffffffffffe8;
  wchar_t in_stack_fffffffffffffff8;
  wchar_t in_stack_fffffffffffffffc;
  
  a_00 = archive_read_new();
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                   in_stack_fffffffffffffff8,(char *)a_00,in_stack_ffffffffffffffe8);
  archive_read_support_filter_all(in_stack_ffffffffffffffe8);
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                   in_stack_fffffffffffffff8,(char *)a_00,in_stack_ffffffffffffffe8);
  archive_read_support_format_all(in_stack_ffffffffffffffe8);
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                   in_stack_fffffffffffffff8,(char *)a_00,in_stack_ffffffffffffffe8);
  archive_read_open_memory(a_00,in_stack_ffffffffffffffe8,0x1784c6);
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                   in_stack_fffffffffffffff8,(char *)a_00,in_stack_ffffffffffffffe8);
  archive_read_next_header(a_00,(archive_entry **)in_stack_ffffffffffffffe8);
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                   in_stack_fffffffffffffff8,(char *)a_00,in_stack_ffffffffffffffe8);
  archive_filter_code(a_00,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                   in_stack_fffffffffffffff8,(char *)a_00,in_stack_ffffffffffffffe8);
  archive_format(a_00);
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                   in_stack_fffffffffffffff8,(char *)a_00,in_stack_ffffffffffffffe8);
  archive_entry_is_encrypted
            ((archive_entry *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)a_00,0,
                      (char *)0x1785cf,in_stack_00000020);
  archive_read_has_encrypted_entries
            ((archive *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)a_00,
                      (longlong)a_00,(char *)0x17860b,in_stack_00000020);
  archive_read_close((archive *)0x178615);
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)a_00,
                      (longlong)a_00,(char *)0x178644,in_stack_00000020);
  archive_read_free((archive *)0x17864e);
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)a_00,0,
                      (char *)0x17867c,in_stack_00000020);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_empty)
{
	struct archive_entry *ae;
	struct archive *a;
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_open_memory(a, archive, 0));
	assertA(ARCHIVE_EOF == archive_read_next_header(a, &ae));
	assertA(archive_filter_code(a, 0) == ARCHIVE_FILTER_NONE);
	assertA(archive_format(a) == ARCHIVE_FORMAT_EMPTY);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}